

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop.h
# Opt level: O1

double currentPosition(void)

{
  time_t tVar1;
  double dVar2;
  
  dVar2 = s_currentPosition;
  if (currentlyPlaying) {
    if (0.0 <= s_currentPosition) {
      tVar1 = time((time_t *)0x0);
      dVar2 = round(((double)tVar1 - s_lastPositionFetched) + s_currentPosition);
      return dVar2;
    }
    dVar2 = -1.0;
  }
  return dVar2;
}

Assistant:

static double currentPosition()
{
    if (!currentlyPlaying) {
        return s_currentPosition;
    }

    if (s_currentPosition < 0) {
        return -1;
    }
    double timeDelta = time(nullptr) - s_lastPositionFetched;
    return std::round(timeDelta + s_currentPosition);
}